

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

int ON_Font::CompareFontNameToHyphenWideChar(wchar_t *lhs,wchar_t *rhs)

{
  bool bVar1;
  int iVar2;
  ON_SHA1_Hash OStack_58;
  ON_SHA1_Hash local_44;
  
  iVar2 = 0;
  if (lhs != rhs) {
    if (lhs == (wchar_t *)0x0) {
      iVar2 = 1;
    }
    else if (rhs == (wchar_t *)0x0) {
      iVar2 = -1;
    }
    else {
      FontNameHash(&local_44,lhs,true);
      FontNameHash(&OStack_58,rhs,true);
      bVar1 = ::operator==(&local_44,&OStack_58);
      if (!bVar1) {
        iVar2 = ON_wString::CompareOrdinal(lhs,rhs,true);
      }
    }
  }
  return iVar2;
}

Assistant:

int ON_Font::CompareFontNameToHyphenWideChar(const wchar_t* lhs, const wchar_t* rhs)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  if (ON_Font::FontNameHash(lhs, true) == ON_Font::FontNameHash(rhs, true))
    return 0;
  return ON_wString::CompareOrdinal(lhs, rhs, true);
}